

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

void test_stdio_over_pipes(int overlapped)

{
  int iVar1;
  uv_stdio_flags uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a_1;
  uv_stdio_container_t stdio [3];
  uv_process_t process;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_exepath(exepath,&exepath_size);
  eval_a_1 = (int64_t)iVar1;
  stdio[0].flags = UV_IGNORE;
  stdio[0]._4_4_ = 0;
  process.data = (void *)eval_a_1;
  if ((void *)eval_a_1 == (void *)0x0) {
    args[0] = exepath;
    args[1] = "stdio_over_pipes_helper";
    args[2] = (char *)0x0;
    exepath[exepath_size] = '\0';
    options.file = exepath;
    options.args = args;
    options.exit_cb = exit_cb;
    uv_pipe_init(loop,&out,0);
    uv_pipe_init(loop,&in,0);
    options.stdio = stdio;
    uVar2 = (uint)(overlapped != 0) * 0x40;
    stdio[0].flags = uVar2 + (UV_READABLE_PIPE|UV_CREATE_PIPE);
    stdio[0].data.stream = (uv_stream_t *)&in;
    stdio[1].flags = uVar2 | (UV_WRITABLE_PIPE|UV_CREATE_PIPE);
    stdio[1].data.stream = (uv_stream_t *)&out;
    stdio[2].flags = UV_INHERIT_FD;
    options.stdio_count = 3;
    stdio[2].data._0_4_ = stdio[2].flags;
    iVar1 = uv_spawn(loop,&process,&options);
    eval_a_1 = (int64_t)iVar1;
    eval_b = 0;
    if ((void *)eval_a_1 == (void *)0x0) {
      iVar1 = uv_read_start(&out,on_alloc,on_read);
      eval_a_1 = (int64_t)iVar1;
      eval_b = 0;
      if ((void *)eval_a_1 == (void *)0x0) {
        iVar1 = uv_run(loop,0);
        eval_a_1 = (int64_t)iVar1;
        eval_b = 0;
        if ((void *)eval_a_1 == (void *)0x0) {
          eval_a_1 = (int64_t)on_read_cb_called;
          eval_b = 1;
          if (eval_a_1 < 2) {
            pcVar5 = ">";
            pcVar6 = "1";
            pcVar4 = "on_read_cb_called";
            uVar3 = 0x97;
          }
          else {
            eval_a_1 = 2;
            eval_b = (int64_t)after_write_cb_called;
            if (eval_b == 2) {
              eval_a_1 = 1;
              eval_b = (int64_t)exit_cb_called;
              if (eval_b == 1) {
                eval_a_1 = 3;
                eval_b = (int64_t)close_cb_called;
                if (eval_b == 3) {
                  iVar1 = memcmp("hello world\nhello world\n",output,0x18);
                  eval_a_1 = (int64_t)iVar1;
                  eval_b = 0;
                  if ((void *)eval_a_1 == (void *)0x0) {
                    eval_a_1 = 0x18;
                    eval_b = (int64_t)output_used;
                    if (eval_b == 0x18) {
                      close_loop(loop);
                      eval_a_1 = 0;
                      iVar1 = uv_loop_close(loop);
                      eval_b = (int64_t)iVar1;
                      if (eval_b == 0) {
                        uv_library_shutdown();
                        return;
                      }
                      pcVar5 = "==";
                      pcVar6 = "uv_loop_close(loop)";
                      pcVar4 = "0";
                      uVar3 = 0x9e;
                    }
                    else {
                      pcVar5 = "==";
                      pcVar6 = "output_used";
                      pcVar4 = "24";
                      uVar3 = 0x9c;
                    }
                  }
                  else {
                    pcVar5 = "==";
                    pcVar6 = "0";
                    pcVar4 = "memcmp(\"hello world\\nhello world\\n\", output, 24)";
                    uVar3 = 0x9b;
                  }
                }
                else {
                  pcVar5 = "==";
                  pcVar6 = "close_cb_called";
                  pcVar4 = "3";
                  uVar3 = 0x9a;
                }
              }
              else {
                pcVar5 = "==";
                pcVar6 = "exit_cb_called";
                pcVar4 = "1";
                uVar3 = 0x99;
              }
            }
            else {
              pcVar5 = "==";
              pcVar6 = "after_write_cb_called";
              pcVar4 = "2";
              uVar3 = 0x98;
            }
          }
        }
        else {
          pcVar5 = "==";
          pcVar6 = "0";
          pcVar4 = "r";
          uVar3 = 0x95;
        }
      }
      else {
        pcVar5 = "==";
        pcVar6 = "0";
        pcVar4 = "r";
        uVar3 = 0x92;
      }
    }
    else {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "r";
      uVar3 = 0x8f;
    }
  }
  else {
    pcVar6 = "0";
    pcVar4 = "r";
    uVar3 = 0x41;
    eval_b = 0;
    pcVar5 = "==";
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a_1,pcVar5,eval_b);
  abort();
}

Assistant:

static void test_stdio_over_pipes(int overlapped) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[3];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE |
      (overlapped ?  UV_OVERLAPPED_PIPE : 0);
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE |
      (overlapped ? UV_OVERLAPPED_PIPE : 0);
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = uv_get_osfhandle(2);
  options.stdio_count = 3;

  r = uv_spawn(loop, &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_GT(on_read_cb_called, 1);
  ASSERT_EQ(2, after_write_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_OK(memcmp("hello world\nhello world\n", output, 24));
  ASSERT_EQ(24, output_used);

  MAKE_VALGRIND_HAPPY(loop);
}